

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::error::CodeEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,error *this,Code code)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "OK";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "CANCELLED";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "INVALID_ARGUMENT";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "DEADLINE_EXCEEDED";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "NOT_FOUND";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "ALREADY_EXISTS";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "PERMISSION_DENIED";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "RESOURCE_EXHAUSTED";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "FAILED_PRECONDITION";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "ABORTED";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "OUT_OF_RANGE";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "UNIMPLEMENTED";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "INTERNAL";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "UNAVAILABLE";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "DATA_LOSS";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "UNAUTHENTICATED";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline string CodeEnumToString(error::Code code) {
  switch (code) {
    case OK:
      return "OK";
    case CANCELLED:
      return "CANCELLED";
    case UNKNOWN:
      return "UNKNOWN";
    case INVALID_ARGUMENT:
      return "INVALID_ARGUMENT";
    case DEADLINE_EXCEEDED:
      return "DEADLINE_EXCEEDED";
    case NOT_FOUND:
      return "NOT_FOUND";
    case ALREADY_EXISTS:
      return "ALREADY_EXISTS";
    case PERMISSION_DENIED:
      return "PERMISSION_DENIED";
    case UNAUTHENTICATED:
      return "UNAUTHENTICATED";
    case RESOURCE_EXHAUSTED:
      return "RESOURCE_EXHAUSTED";
    case FAILED_PRECONDITION:
      return "FAILED_PRECONDITION";
    case ABORTED:
      return "ABORTED";
    case OUT_OF_RANGE:
      return "OUT_OF_RANGE";
    case UNIMPLEMENTED:
      return "UNIMPLEMENTED";
    case INTERNAL:
      return "INTERNAL";
    case UNAVAILABLE:
      return "UNAVAILABLE";
    case DATA_LOSS:
      return "DATA_LOSS";
  }

  // No default clause, clang will abort if a code is missing from
  // above switch.
  return "UNKNOWN";
}